

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

void printCompositorTypeConnector(COMPOSITOR_TYPE type)

{
  COMPOSITOR_TYPE type_local;
  
  if (type == COMPOSITOR_SEQUENCE) {
    std::operator<<((ostream *)&std::cout,",");
  }
  else if (type == COMPOSITOR_CHOICE) {
    std::operator<<((ostream *)&std::cout,"|");
  }
  else if (type == COMPOSITOR_ALL) {
    std::operator<<((ostream *)&std::cout,"*");
  }
  return;
}

Assistant:

void printCompositorTypeConnector(XSModelGroup::COMPOSITOR_TYPE type)
{
    switch (type) {
        case XSModelGroup::COMPOSITOR_SEQUENCE :
            std::cout << ",";
            break;
        case XSModelGroup::COMPOSITOR_CHOICE :
            std::cout << "|";
            break;
        case XSModelGroup::COMPOSITOR_ALL :
            std::cout << "*";
            break;
    }
}